

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O1

void __thiscall VGMPlayer::Cmd_DataBlock(VGMPlayer *this)

{
  UINT32 *pUVar1;
  byte bVar2;
  uint uVar3;
  UINT32 memSize;
  iterator iVar4;
  void *pvVar5;
  UINT8 UVar6;
  uint uVar7;
  CHIP_DEVICE *pCVar8;
  uint uVar9;
  uint *puVar10;
  long lVar11;
  char *format;
  PCM_BANK *this_00;
  long lVar12;
  byte chipID;
  UINT32 *data;
  uint inLen;
  UINT8 *pUVar13;
  UINT32 oldLen;
  PCM_CDB_INF dbCI;
  uint local_54;
  uint local_50;
  UINT32 local_4c;
  PCM_CDB_INF local_48;
  
  pUVar13 = this->_fileData;
  uVar7 = this->_filePos;
  bVar2 = pUVar13[(ulong)uVar7 + 2];
  uVar9 = (uint)bVar2;
  uVar3 = *(uint *)(pUVar13 + (ulong)uVar7 + 3);
  inLen = uVar3 & 0x7fffffff;
  uVar7 = uVar7 + 7;
  this->_filePos = uVar7;
  if (bVar2 >> 6 < 2) {
    if (this->_curLoop != 0) {
      return;
    }
    if (uVar9 == 0x7f) {
      ReadPCMComprTable(inLen,pUVar13 + uVar7,&this->_pcmComprTbl);
    }
    else {
      uVar9 = uVar9 & 0x3f;
      this_00 = this->_pcmBank + uVar9;
      local_50 = *(int *)&this->_pcmBank[uVar9].data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                 *(int *)&(this_00->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
      pUVar13 = pUVar13 + uVar7;
      local_54 = inLen;
      if ((bVar2 & 0x40) == 0) {
        iVar4._M_current =
             this->_pcmBank[uVar9].bankOfs.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            this->_pcmBank[uVar9].bankOfs.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     &this->_pcmBank[uVar9].bankOfs,iVar4,&local_50);
        }
        else {
          *iVar4._M_current = local_50;
          this->_pcmBank[uVar9].bankOfs.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        iVar4._M_current =
             this->_pcmBank[uVar9].bankSize.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            this->_pcmBank[uVar9].bankSize.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     &this->_pcmBank[uVar9].bankSize,iVar4,&local_54);
        }
        else {
          *iVar4._M_current = local_54;
          this->_pcmBank[uVar9].bankSize.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&this_00->data,(ulong)(local_54 + local_50));
        memcpy((this_00->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start + local_50,pUVar13,(ulong)local_54);
      }
      else {
        ReadComprDataBlkHdr(inLen,pUVar13,&local_48);
        local_48.cmprInfo.comprTbl = &this->_pcmComprTbl;
        local_54 = local_48.decmpLen;
        iVar4._M_current =
             this->_pcmBank[uVar9].bankOfs.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            this->_pcmBank[uVar9].bankOfs.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     &this->_pcmBank[uVar9].bankOfs,iVar4,&local_50);
        }
        else {
          *iVar4._M_current = local_50;
          this->_pcmBank[uVar9].bankOfs.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        iVar4._M_current =
             this->_pcmBank[uVar9].bankSize.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            this->_pcmBank[uVar9].bankSize.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     &this->_pcmBank[uVar9].bankSize,iVar4,&local_54);
        }
        else {
          *iVar4._M_current = local_54;
          this->_pcmBank[uVar9].bankSize.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&this_00->data,(ulong)(local_54 + local_50));
        UVar6 = DecompressDataBlk(local_54,(this_00->data).
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start + local_50,
                                  inLen - local_48.hdrSize,pUVar13 + local_48.hdrSize,
                                  &local_48.cmprInfo);
        if (UVar6 == 0x80) {
          format = "Unknown data block compression!\n";
        }
        else if (UVar6 == '\x11') {
          format = "Data block and loaded value table incompatible!\n";
        }
        else {
          if (UVar6 != '\x10') goto LAB_001208ae;
          format = "Error loading table-compressed data block! No table loaded!\n";
        }
        emu_logf(&this->_logger,'\x01',format);
      }
    }
    goto LAB_001208ae;
  }
  chipID = (byte)(uVar3 >> 0x1f);
  if (bVar2 >> 6 == 2) {
    uVar9 = uVar9 & 0x3f;
    UVar6 = _VGM_ROM_CHIPS[uVar9][0];
    pCVar8 = GetDevicePtr(this,UVar6,chipID);
    if (pCVar8 != (CHIP_DEVICE *)0x0) {
      pUVar1 = (UINT32 *)(this->_fileData + this->_filePos);
      data = pUVar1 + 2;
      memSize = *pUVar1;
      local_4c = pUVar1[1];
      local_54 = inLen - 8;
      if (((UVar6 == '\x1c') && (local_54 != 0)) && ((pCVar8->flags & 1) != 0)) {
        local_54 = local_54 & 0xfffffffe;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
                   (ulong)local_54,(allocator_type *)&local_50);
        if (local_54 != 0) {
          uVar7 = 0;
          do {
            *(undefined1 *)(CONCAT44(local_48.decmpLen,local_48.hdrSize) + (ulong)uVar7) =
                 *(undefined1 *)((long)data + (ulong)(uVar7 + 1));
            *(undefined1 *)(CONCAT44(local_48.decmpLen,local_48.hdrSize) + (ulong)(uVar7 + 1)) =
                 *(undefined1 *)((long)data + (ulong)uVar7);
            uVar7 = uVar7 + 2;
          } while (uVar7 < local_54);
        }
        WriteChipROM(pCVar8,_VGM_ROM_CHIPS[uVar9][1],memSize,local_4c,local_54,
                     (UINT8 *)CONCAT44(local_48.decmpLen,local_48.hdrSize));
        pvVar5 = (void *)CONCAT44(local_48.decmpLen,local_48.hdrSize);
        if (pvVar5 != (void *)0x0) {
          operator_delete(pvVar5,(long)local_48.cmprInfo.comprTbl - (long)pvVar5);
        }
      }
      else {
        WriteChipROM(pCVar8,_VGM_ROM_CHIPS[uVar9][1],memSize,local_4c,local_54,(UINT8 *)data);
      }
    }
    goto LAB_001208ae;
  }
  UVar6 = _VGM_RAM_CHIPS[bVar2 & 0x3f];
  pCVar8 = GetDevicePtr(this,UVar6,chipID);
  if ((pCVar8 == (CHIP_DEVICE *)0x0) || (pCVar8->romWrite == (DEVFUNC_WRITE_BLOCK)0x0))
  goto LAB_001208ae;
  puVar10 = (uint *)(this->_fileData + this->_filePos);
  if ((bVar2 & 0x20) == 0) {
    uVar7 = (uint)(ushort)*puVar10;
    local_54 = inLen - 2;
    lVar12 = 2;
  }
  else {
    uVar7 = *puVar10;
    local_54 = inLen - 4;
    lVar12 = 4;
  }
  if (UVar6 == '\x05') {
    lVar11 = 0x6998;
LAB_00120785:
    uVar7 = uVar7 | (uint)*(byte *)((long)&(this->super_PlayerBase)._vptr_PlayerBase +
                                   (ulong)(uVar3 >> 0x1f) + lVar11) << 0xc;
  }
  else if (UVar6 == '\x10') {
    lVar11 = 0x699a;
    goto LAB_00120785;
  }
  (*pCVar8->romWrite)((pCVar8->base).defInf.dataPtr,uVar7,local_54,(UINT8 *)((long)puVar10 + lVar12)
                     );
LAB_001208ae:
  this->_filePos = this->_filePos + inLen;
  return;
}

Assistant:

void VGMPlayer::Cmd_DataBlock(void)
{
	UINT8 dblkType;
	UINT8 chipType;
	UINT8 chipID;
	UINT32 dblkLen;
	UINT32 memSize;
	UINT32 dataOfs;
	UINT32 dataLen;
	const UINT8* dataPtr;
	CHIP_DEVICE* cDev;
	
	dblkType = fData[0x02];
	dblkLen = ReadLE32(&fData[0x03]);
	chipID = (dblkLen & 0x80000000) >> 31;
	dblkLen &= 0x7FFFFFFF;
	_filePos += 0x07;
	
	switch(dblkType & 0xC0)
	{
	case 0x00:	// uncompressed data block
	case 0x40:	// compressed data block
		if (_curLoop > 0)
			return;	// skip during the 2nd/3rd/... loop, as these blocks were already loaded
		
		if (dblkType == 0x7F)
		{
			ReadPCMComprTable(dblkLen, &fData[0x00], &_pcmComprTbl);
		}
		else
		{
			PCM_BANK* pcmBnk = &_pcmBank[dblkType & 0x3F];
			PCM_CDB_INF dbCI;
			UINT32 oldLen = (UINT32)pcmBnk->data.size();
			dataLen = dblkLen;
			dataPtr = &fData[0x00];
			
			if (dblkType & 0x40)
			{
				ReadComprDataBlkHdr(dblkLen, dataPtr, &dbCI);
				dbCI.cmprInfo.comprTbl = &_pcmComprTbl;
				dataLen = dbCI.decmpLen;
			}
			
			pcmBnk->bankOfs.push_back(oldLen);
			pcmBnk->bankSize.push_back(dataLen);
			
			pcmBnk->data.resize(oldLen + dataLen);
			if (dblkType & 0x40)
			{
				UINT8 retVal = DecompressDataBlk(dataLen, &pcmBnk->data[oldLen],
					dblkLen - dbCI.hdrSize, &dataPtr[dbCI.hdrSize], &dbCI.cmprInfo);
				if (retVal == 0x10)
					emu_logf(&_logger, PLRLOG_ERROR, "Error loading table-compressed data block! No table loaded!\n");
				else if (retVal == 0x11)
					emu_logf(&_logger, PLRLOG_ERROR, "Data block and loaded value table incompatible!\n");
				else if (retVal == 0x80)
					emu_logf(&_logger, PLRLOG_ERROR, "Unknown data block compression!\n");
			}
			else
			{
				memcpy(&pcmBnk->data[oldLen], dataPtr, dataLen);
			}
			
			// TODO: refresh DAC Stream pointers (call daccontrol_refresh_data)
		}
		break;
	case 0x80:	// ROM/RAM write
		chipType = _VGM_ROM_CHIPS[dblkType & 0x3F][0];
		cDev = GetDevicePtr(chipType, chipID);
		if (cDev == NULL)
			break;
		
		memSize = ReadLE32(&fData[0x00]);
		dataOfs = ReadLE32(&fData[0x04]);
		dataPtr = &fData[0x08];
		dataLen = dblkLen - 0x08;
		if (chipType == 0x1C && dataLen && (cDev->flags & 0x01))
		{
			// chip == ASIC 219 (ID 0x1C + flags 0x01): byte-swap sample data
			dataLen &= ~0x01;
			std::vector<UINT8> swpData(dataLen);
			for (UINT32 curPos = 0x00; curPos < dataLen; curPos += 0x02)
			{
				swpData[curPos + 0x00] = dataPtr[curPos + 0x01];
				swpData[curPos + 0x01] = dataPtr[curPos + 0x00];
			}
			WriteChipROM(cDev, _VGM_ROM_CHIPS[dblkType & 0x3F][1], memSize, dataOfs, dataLen, &swpData[0x00]);
		}
		else
		{
			WriteChipROM(cDev, _VGM_ROM_CHIPS[dblkType & 0x3F][1], memSize, dataOfs, dataLen, dataPtr);
		}
		break;
	case 0xC0:	// RAM Write
		chipType = _VGM_RAM_CHIPS[dblkType & 0x3F];
		cDev = GetDevicePtr(chipType, chipID);
		if (cDev == NULL || cDev->romWrite == NULL)
			break;
		
		if (! (dblkType & 0x20))
		{
			// C0..DF: 16-bit addressing
			dataOfs = ReadLE16(&fData[0x00]);
			dataLen = dblkLen - 0x02;
			dataPtr = &fData[0x02];
		}
		else
		{
			// E0..FF: 32-bit addressing
			dataOfs = ReadLE32(&fData[0x00]);
			dataLen = dblkLen - 0x04;
			dataPtr = &fData[0x04];
		}
		DoRAMOfsPatches(chipType, chipID, dataOfs, dataLen);
		cDev->romWrite(cDev->base.defInf.dataPtr, dataOfs, dataLen, dataPtr);
		break;
	}
	
	_filePos += dblkLen;
	return;
}